

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fReadPixelsTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::ReadPixelsTest::iterate(ReadPixelsTest *this)

{
  int iVar1;
  ChannelOrder CVar2;
  TestLog *log;
  ChannelOrder CVar3;
  GLenum GVar4;
  undefined8 dst;
  bool bVar5;
  GLenum GVar6;
  RenderTarget *pRVar7;
  byte bVar8;
  char *pcVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  GLint glType;
  GLint glFormat;
  TextureFormat format;
  int pixelSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelData;
  IVec4 formatBitDepths;
  Random rnd;
  Texture2D resultRGBA8;
  Texture2D reference;
  Texture2D referenceRGBA8;
  GLenum local_2d8;
  GLenum local_2d4;
  TextureFormat local_2d0;
  ReadPixelsTest *local_2c8;
  int local_2bc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b8;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  deRandom local_288;
  undefined1 local_278 [80];
  undefined1 local_228 [80];
  PixelBufferAccess local_1d8;
  undefined1 local_1b0 [8];
  float local_1a8;
  float local_1a4;
  ConstPixelBufferAccess *local_190;
  ios_base local_138 [264];
  
  deRandom_init(&local_288,this->m_seed);
  local_2d0.order = RGBA;
  local_2d0.type = UNORM_INT8;
  getFormatInfo(this,&local_2d0,(GLint *)&local_2d4,(GLint *)&local_2d8,&local_2bc);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Format: ",8);
  local_228._0_8_ = glu::getTextureFormatName;
  local_228._8_4_ = local_2d4;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_228,(ostream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", Type: ",8);
  local_278._0_8_ = glu::getTypeName;
  local_278._8_4_ = local_2d8;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_278,(ostream *)&local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  tcu::Texture2D::Texture2D((Texture2D *)local_228,&local_2d0,0xd,0xd);
  tcu::Texture2D::allocLevel((Texture2D *)local_228,0);
  glwViewport(0,0,0xd,0xd);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glViewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,0xbb);
  fVar11 = deRandom_getFloat(&local_288);
  fVar12 = deRandom_getFloat(&local_288);
  fVar13 = deRandom_getFloat(&local_288);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Clear color: (",0xe);
  std::ostream::_M_insert<double>((double)fVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::_M_insert<double>((double)fVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::_M_insert<double>((double)fVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
  std::ostream::_M_insert<double>(1.0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  glwClearColor(fVar11,fVar12,fVar13,1.0);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glClearColor(red, green, blue, alpha)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,199);
  glwClear(0x4000);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,200);
  local_1b0._4_4_ = fVar12;
  local_1b0._0_4_ = fVar11;
  local_1a4 = 1.0;
  local_1a8 = fVar13;
  tcu::clear((PixelBufferAccess *)local_228._32_8_,(Vec4 *)local_1b0);
  render(this,(Texture2D *)local_228);
  local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar10 = this->m_alignment;
  fVar11 = ceilf((float)(local_2bc * 0xd) / (float)iVar10);
  iVar10 = (int)fVar11 * iVar10;
  local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_2b8,(long)(iVar10 * 0xd),local_1b0);
  glwPixelStorei(0xd05,this->m_alignment);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glPixelStorei(GL_PACK_ALIGNMENT, m_alignment)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,0xd4);
  glwReadPixels(0,0,0xd,0xd,local_2d4,local_2d8,
                local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start);
  GVar6 = glwGetError();
  glu::checkError(GVar6,"glReadPixels(0, 0, width, height, glFormat, glType, &(pixelData[0]))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                  ,0xd5);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar7->m_numSamples < 2) {
    tcu::getTextureFormatBitDepth((tcu *)local_278,&local_2d0);
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    CVar2 = (pRVar7->m_pixelFormat).redBits;
    CVar3 = local_278._0_4_;
    if ((int)CVar2 < (int)local_278._0_4_) {
      CVar3 = CVar2;
    }
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = (pRVar7->m_pixelFormat).greenBits;
    bVar8 = SUB81(local_278._0_8_,4);
    if (iVar1 < (int)local_278._4_4_) {
      bVar8 = (byte)iVar1;
    }
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    GVar6 = (pRVar7->m_pixelFormat).blueBits;
    GVar4 = local_278._8_4_;
    if ((int)GVar6 < (int)local_278._8_4_) {
      GVar4 = GVar6;
    }
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = (pRVar7->m_pixelFormat).alphaBits;
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_2c8 = this;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_2d0,0xd,0xd,1,iVar10,0,
               local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (iVar1 < (int)local_278._12_4_) {
      local_278._12_4_ = iVar1;
    }
    local_1d8.super_ConstPixelBufferAccess.m_size.m_data[0] =
         (int)(2.0 / (float)(1 << ((byte)GVar4 & 0x1f)));
    local_1d8.super_ConstPixelBufferAccess.m_size.m_data[1] =
         (int)(2.0 / (float)(1 << ((byte)local_278._12_4_ & 0x1f)));
    local_1d8.super_ConstPixelBufferAccess.m_format.type =
         (ChannelType)(2.0 / (float)(1 << (bVar8 & 0x1f)));
    local_1d8.super_ConstPixelBufferAccess.m_format.order =
         (ChannelOrder)(2.0 / (float)(1 << ((byte)CVar3 & 0x1f)));
    bVar5 = tcu::floatThresholdCompare
                      (log,"Result","Result",(ConstPixelBufferAccess *)local_228._32_8_,
                       (ConstPixelBufferAccess *)local_1b0,(Vec4 *)&local_1d8,COMPARE_LOG_RESULT);
    pcVar9 = "Fail";
    if (bVar5) {
      pcVar9 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_2c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,
               pcVar9);
  }
  else {
    tcu::getTextureFormatBitDepth((tcu *)&local_298,&local_2d0);
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = (pRVar7->m_pixelFormat).redBits;
    if (iVar1 < local_298) {
      local_298 = iVar1;
    }
    fVar11 = ceilf((2.0 / (float)(1 << ((byte)local_298 & 0x1f))) * 256.0);
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = (pRVar7->m_pixelFormat).greenBits;
    bVar8 = (byte)local_294;
    if (iVar1 < local_294) {
      bVar8 = (byte)iVar1;
    }
    fVar12 = ceilf((2.0 / (float)(1 << (bVar8 & 0x1f))) * 256.0);
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = (pRVar7->m_pixelFormat).blueBits;
    if (iVar1 < local_290) {
      local_290 = iVar1;
    }
    fVar13 = ceilf((2.0 / (float)(1 << ((byte)local_290 & 0x1f))) * 256.0);
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar1 = (pRVar7->m_pixelFormat).alphaBits;
    bVar8 = (byte)local_28c;
    if (iVar1 < local_28c) {
      bVar8 = (byte)iVar1;
    }
    fVar14 = ceilf((2.0 / (float)(1 << (bVar8 & 0x1f))) * 256.0);
    local_2c8 = (ReadPixelsTest *)CONCAT44(local_2c8._4_4_,fVar14);
    local_278._0_4_ = RGBA;
    local_278._4_4_ = UNORM_INT8;
    tcu::Texture2D::Texture2D((Texture2D *)local_1b0,(TextureFormat *)local_278,0xd,0xd);
    local_1d8.super_ConstPixelBufferAccess.m_format.order = RGBA;
    local_1d8.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
    tcu::Texture2D::Texture2D((Texture2D *)local_278,(TextureFormat *)&local_1d8,0xd,0xd);
    tcu::Texture2D::allocLevel((Texture2D *)local_1b0,0);
    tcu::Texture2D::allocLevel((Texture2D *)local_278,0);
    tcu::copy((EVP_PKEY_CTX *)local_190,(EVP_PKEY_CTX *)local_228._32_8_);
    dst = local_278._32_8_;
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_1d8,&local_2d0,0xd,0xd,1,iVar10,0,
               local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)&local_1d8);
    bVar5 = tcu::bilinearCompare
                      (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                       "Result","Result",local_190,(ConstPixelBufferAccess *)local_278._32_8_,
                       (RGBA)(((int)fVar13 & 0xffU) << 0x10 |
                              ((int)fVar12 & 0xffU) << 8 | (int)fVar11 & 0xffU |
                             (int)local_2c8._0_4_ << 0x18),COMPARE_LOG_RESULT);
    pcVar9 = "Fail";
    if (bVar5) {
      pcVar9 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,pcVar9);
    tcu::Texture3D::~Texture3D((Texture3D *)local_278);
    tcu::Texture3D::~Texture3D((Texture3D *)local_1b0);
  }
  if (local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)local_228);
  return STOP;
}

Assistant:

TestCase::IterateResult ReadPixelsTest::iterate (void)
{
	// Create reference
	const int					width	= 13;
	const int					height	= 13;

	de::Random					rnd(m_seed);

	tcu::TextureFormat			format(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
	int							pixelSize;
	GLint						glFormat;
	GLint						glType;

	getFormatInfo(format, glFormat, glType, pixelSize);
	m_testCtx.getLog() << tcu::TestLog::Message << "Format: " << glu::getTextureFormatStr(glFormat) << ", Type: " << glu::getTypeStr(glType) << tcu::TestLog::EndMessage;

	tcu::Texture2D reference(format, width, height);
	reference.allocLevel(0);

	GLU_CHECK_CALL(glViewport(0, 0, width, height));

	// Clear color
	{
		const float red		= rnd.getFloat();
		const float green	= rnd.getFloat();
		const float blue	= rnd.getFloat();
		const float alpha	= 1.0f;

		m_testCtx.getLog() << tcu::TestLog::Message << "Clear color: (" << red << ", " << green << ", " << blue << ", " << alpha << ")" << tcu::TestLog::EndMessage;

		// Clear target
		GLU_CHECK_CALL(glClearColor(red, green, blue, alpha));
		GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));

		tcu::clear(reference.getLevel(0), tcu::Vec4(red, green, blue, alpha));
	}

	render(reference);

	std::vector<deUint8> pixelData;
	const int rowPitch = m_alignment * deCeilFloatToInt32(float(pixelSize * width) / (float)m_alignment);

	pixelData.resize(rowPitch * height, 0);

	GLU_CHECK_CALL(glPixelStorei(GL_PACK_ALIGNMENT, m_alignment));
	GLU_CHECK_CALL(glReadPixels(0, 0, width, height, glFormat, glType, &(pixelData[0])));

	if (m_context.getRenderTarget().getNumSamples() > 1)
	{
		const tcu::IVec4	formatBitDepths	= tcu::getTextureFormatBitDepth(format);
		const deUint8		redThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().redBits,	formatBitDepths.x()))));
		const deUint8		greenThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().greenBits,	formatBitDepths.y()))));
		const deUint8		blueThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().blueBits,	formatBitDepths.z()))));
		const deUint8		alphaThreshold	= (deUint8)deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().alphaBits,	formatBitDepths.w()))));

		// bilinearCompare only accepts RGBA, UINT8
		tcu::Texture2D		referenceRGBA8	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);
		tcu::Texture2D		resultRGBA8		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);

		referenceRGBA8.allocLevel(0);
		resultRGBA8.allocLevel(0);

		tcu::copy(referenceRGBA8.getLevel(0), reference.getLevel(0));
		tcu::copy(resultRGBA8.getLevel(0), tcu::PixelBufferAccess(format, width, height, 1, rowPitch, 0, &(pixelData[0])));

		if (tcu::bilinearCompare(m_testCtx.getLog(), "Result", "Result", referenceRGBA8.getLevel(0), resultRGBA8.getLevel(0), tcu::RGBA(redThreshold, greenThreshold, blueThreshold, alphaThreshold), tcu::COMPARE_LOG_RESULT))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		const tcu::IVec4	formatBitDepths	= tcu::getTextureFormatBitDepth(format);
		const float			redThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().redBits,		formatBitDepths.x()));
		const float			greenThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().greenBits,	formatBitDepths.y()));
		const float			blueThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().blueBits,	formatBitDepths.z()));
		const float			alphaThreshold	= 2.0f / (float)(1 << deMin32(m_context.getRenderTarget().getPixelFormat().alphaBits,	formatBitDepths.w()));

		// Compare
		if (tcu::floatThresholdCompare(m_testCtx.getLog(), "Result", "Result", reference.getLevel(0), tcu::PixelBufferAccess(format, width, height, 1, rowPitch, 0, &(pixelData[0])), tcu::Vec4(redThreshold, greenThreshold, blueThreshold, alphaThreshold), tcu::COMPARE_LOG_RESULT))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}